

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_encoder.c
# Opt level: O3

int pt_enc_next(pt_encoder *encoder,pt_packet *packet)

{
  byte *pbVar1;
  ushort uVar2;
  uint16_t uVar3;
  pt_ip_compression pVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  pt_packet_pwre pVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  byte *pbVar15;
  pt_opcode op;
  int iVar16;
  byte bVar17;
  byte local_27 [15];
  
  if (packet == (pt_packet *)0x0 || encoder == (pt_encoder *)0x0) {
    return -2;
  }
  if (0x1a < packet->type - ppt_pad) {
    return -4;
  }
  pbVar15 = encoder->pos;
  switch(packet->type) {
  case ppt_pad:
    if (pbVar15 != (byte *)0x0) {
      pbVar1 = pbVar15 + 1;
      if (pbVar1 < (encoder->config).begin) {
        return -7;
      }
      if (pbVar1 <= (encoder->config).end) {
        *pbVar15 = 0;
        encoder->pos = pbVar1;
        return 1;
      }
      return -7;
    }
    break;
  case ppt_psb:
    if (pbVar15 != (byte *)0x0) {
      if (pbVar15 + 0x10 < (encoder->config).begin) {
        return -7;
      }
      if ((encoder->config).end < pbVar15 + 0x10) {
        return -7;
      }
      iVar7 = 0;
      uVar14 = 0x8202820282028202;
      uVar13 = 0x8202820282028202;
      do {
        *pbVar15 = (byte)uVar13;
        pbVar15 = pbVar15 + 1;
        uVar13 = uVar13 >> 8;
        iVar7 = iVar7 + 1;
      } while (iVar7 != 8);
      lVar12 = 0;
      iVar7 = 8;
      do {
        pbVar15[lVar12] = (byte)uVar14;
        uVar14 = uVar14 >> 8;
        lVar12 = lVar12 + 1;
        iVar7 = iVar7 + 1;
      } while ((int)lVar12 != 8);
      pbVar15 = pbVar15 + lVar12;
LAB_00108d9a:
      encoder->pos = pbVar15;
      return iVar7;
    }
    break;
  case ppt_psbend:
    if (pbVar15 == (byte *)0x0) {
      return -1;
    }
    if (pbVar15 + 2 < (encoder->config).begin) {
      return -7;
    }
    if ((encoder->config).end < pbVar15 + 2) {
      return -7;
    }
    pbVar15[0] = 2;
    pbVar15[1] = 0x23;
    goto LAB_00108db1;
  case ppt_fup:
    op = pt_opc_fup;
    goto LAB_00108a7a;
  case ppt_tip:
    op = pt_opc_tip;
    goto LAB_00108a7a;
  case ppt_tip_pge:
    op = pt_opc_tip_pge;
    goto LAB_00108a7a;
  case ppt_tip_pgd:
    op = pt_opc_tip_pgd;
LAB_00108a7a:
    iVar7 = pt_encode_ip(encoder,op,&(packet->payload).ip);
    return iVar7;
  case ppt_tnt_8:
    bVar6 = (packet->payload).tnt.bit_size;
    if (6 < bVar6) {
      return -5;
    }
    if (pbVar15 != (byte *)0x0) {
      pbVar1 = pbVar15 + 1;
      if (pbVar1 < (encoder->config).begin) {
        return -7;
      }
      if (pbVar1 <= (encoder->config).end) {
        *pbVar15 = (char)*(undefined4 *)((long)&packet->payload + 8) * '\x02' |
                   (byte)(1 << ((byte)(bVar6 + 1) & 0x1f));
        encoder->pos = pbVar1;
        return 1;
      }
      return -7;
    }
    break;
  case ppt_tnt_64:
    if (pbVar15 != (byte *)0x0) {
      if (pbVar15 + 8 < (encoder->config).begin) {
        return -7;
      }
      if ((encoder->config).end < pbVar15 + 8) {
        return -7;
      }
      bVar6 = (packet->payload).tnt.bit_size;
      if (0x2f < (ulong)bVar6) {
        return -2;
      }
      uVar14 = (packet->payload).tnt.payload;
      if (uVar14 >> (bVar6 & 0x3f) != 0) {
        return -2;
      }
      pbVar15[0] = 2;
      pbVar15[1] = 0xa3;
      pbVar15 = pbVar15 + 2;
      uVar14 = uVar14 | 1L << ((ulong)bVar6 & 0x3f);
      iVar7 = 2;
      do {
        *pbVar15 = (byte)uVar14;
        pbVar15 = pbVar15 + 1;
        uVar14 = uVar14 >> 8;
        iVar7 = iVar7 + 1;
      } while (iVar7 != 8);
      goto LAB_00108d9a;
    }
    break;
  case ppt_mode:
    if (pbVar15 == (byte *)0x0) {
      return -1;
    }
    if (pbVar15 + 2 < (encoder->config).begin) {
      return -7;
    }
    if ((encoder->config).end < pbVar15 + 2) {
      return -7;
    }
    pVar4 = (packet->payload).ip.ipc;
    if (pVar4 == 0x20) {
      bVar6 = (packet->payload).cfe.vector & 3 | 0x20;
    }
    else {
      if (pVar4 != pt_ipc_suppressed) {
        return -5;
      }
      bVar6 = (packet->payload).cfe.vector & 7;
    }
    *pbVar15 = 0x99;
    goto LAB_00108dae;
  case ppt_pip:
    if (pbVar15 != (byte *)0x0) {
      if (pbVar15 + 8 < (encoder->config).begin) {
        return -7;
      }
      if ((encoder->config).end < pbVar15 + 8) {
        return -7;
      }
      uVar13 = (packet->payload).pip.cr3 >> 4;
      uVar14 = uVar13 | 1;
      if (((packet->payload).ptw.plc & 1) == 0) {
        uVar14 = uVar13 & 0xfffffffffffffffe;
      }
      pbVar15[0] = 2;
      pbVar15[1] = 0x43;
      pbVar15 = pbVar15 + 2;
      iVar7 = 2;
      do {
        *pbVar15 = (byte)uVar14;
        pbVar15 = pbVar15 + 1;
        uVar14 = uVar14 >> 8;
        iVar7 = iVar7 + 1;
      } while (iVar7 != 8);
      iVar7 = 8;
      goto LAB_00108d9a;
    }
    break;
  case ppt_vmcs:
    if (pbVar15 != (byte *)0x0) {
      if (pbVar15 + 7 < (encoder->config).begin) {
        return -7;
      }
      if ((encoder->config).end < pbVar15 + 7) {
        return -7;
      }
      pbVar15[0] = 2;
      pbVar15[1] = 200;
      pbVar15 = pbVar15 + 2;
      uVar14 = (packet->payload).pip.cr3 >> 0xc;
      iVar7 = 2;
      do {
        *pbVar15 = (byte)uVar14;
        pbVar15 = pbVar15 + 1;
        uVar14 = uVar14 >> 8;
        iVar7 = iVar7 + 1;
      } while (iVar7 != 7);
      iVar7 = 7;
      goto LAB_00108d9a;
    }
    break;
  case ppt_cbr:
    if (pbVar15 != (byte *)0x0) {
      if (pbVar15 + 4 < (encoder->config).begin) {
        return -7;
      }
      if ((encoder->config).end < pbVar15 + 4) {
        return -7;
      }
      pbVar15[0] = 2;
      pbVar15[1] = 3;
      pbVar15[2] = (packet->payload).tnt.bit_size;
      pbVar15[3] = 0;
LAB_00108ba9:
      encoder->pos = pbVar15 + 4;
      return 4;
    }
    break;
  case ppt_tsc:
    if (pbVar15 != (byte *)0x0) {
      if (pbVar15 + 8 < (encoder->config).begin) {
        return -7;
      }
      if ((encoder->config).end < pbVar15 + 8) {
        return -7;
      }
      *pbVar15 = 0x19;
      pbVar15 = pbVar15 + 1;
      uVar14 = (packet->payload).pip.cr3;
      iVar7 = 1;
      do {
        *pbVar15 = (byte)uVar14;
        pbVar15 = pbVar15 + 1;
        uVar14 = uVar14 >> 8;
        iVar7 = iVar7 + 1;
      } while (iVar7 != 8);
      iVar7 = 8;
      goto LAB_00108d9a;
    }
    break;
  case ppt_tma:
    if (pbVar15 != (byte *)0x0) {
      pbVar1 = pbVar15 + 7;
      if (pbVar1 < (encoder->config).begin) {
        return -7;
      }
      if (pbVar1 <= (encoder->config).end) {
        uVar2 = (packet->payload).tma.fc;
        if (uVar2 < 0x200) {
          uVar3 = (packet->payload).tma.ctc;
          pbVar15[0] = 2;
          pbVar15[1] = 0x73;
          pbVar15[2] = (byte)uVar3;
          pbVar15[3] = (byte)(uVar3 >> 8);
          pbVar15[4] = 0;
          pbVar15[5] = (byte)uVar2;
          pbVar15[6] = (byte)(uVar2 >> 8);
          encoder->pos = pbVar1;
          return 7;
        }
        return -5;
      }
      return -7;
    }
    break;
  case ppt_mtc:
    if (pbVar15 == (byte *)0x0) {
      return -1;
    }
    if (pbVar15 + 2 < (encoder->config).begin) {
      return -7;
    }
    if ((encoder->config).end < pbVar15 + 2) {
      return -7;
    }
    *pbVar15 = 0x59;
    bVar6 = (packet->payload).tnt.bit_size;
LAB_00108dae:
    pbVar15[1] = bVar6;
LAB_00108db1:
    encoder->pos = pbVar15 + 2;
    return 2;
  case ppt_cyc:
    uVar13 = (packet->payload).pip.cr3;
    local_27[0] = (0x1f < uVar13) << 2 | (char)uVar13 * '\b' | 3;
    uVar14 = 1;
    if (0x1f < uVar13) {
      uVar13 = uVar13 >> 5;
      uVar11 = 1;
      do {
        if (uVar11 == 0xf) {
          return -5;
        }
        uVar14 = uVar11 + 1;
        local_27[uVar11] = 0x7f < uVar13 | (char)uVar13 * '\x02';
        bVar5 = 0x7f < uVar13;
        uVar13 = uVar13 >> 7;
        uVar11 = uVar14;
      } while (bVar5);
    }
    if (pbVar15 != (byte *)0x0) {
      if (pbVar15 + (uVar14 & 0xff) < (encoder->config).begin) {
        return -7;
      }
      if (pbVar15 + (uVar14 & 0xff) <= (encoder->config).end) {
        memcpy(pbVar15,local_27,uVar14 & 0xff);
        encoder->pos = pbVar15 + (char)uVar14;
        return (int)(char)uVar14;
      }
      return -7;
    }
    break;
  case ppt_stop:
    if (pbVar15 != (byte *)0x0) {
      if (pbVar15 + 2 < (encoder->config).begin) {
        return -7;
      }
      if ((encoder->config).end < pbVar15 + 2) {
        return -7;
      }
      pbVar15[0] = 2;
      pbVar15[1] = 0x83;
      goto LAB_00108db1;
    }
    break;
  case ppt_ovf:
    if (pbVar15 != (byte *)0x0) {
      if (pbVar15 + 2 < (encoder->config).begin) {
        return -7;
      }
      if ((encoder->config).end < pbVar15 + 2) {
        return -7;
      }
      pbVar15[0] = 2;
      pbVar15[1] = 0xf3;
      goto LAB_00108db1;
    }
    break;
  case ppt_mnt:
    if (pbVar15 != (byte *)0x0) {
      if (pbVar15 + 0xb < (encoder->config).begin) {
        return -7;
      }
      if ((encoder->config).end < pbVar15 + 0xb) {
        return -7;
      }
      pbVar15[0] = 2;
      pbVar15[1] = 0xc3;
      pbVar15[2] = 0x88;
      pbVar15 = pbVar15 + 3;
      uVar14 = (packet->payload).pip.cr3;
      iVar7 = 3;
      do {
        *pbVar15 = (byte)uVar14;
        pbVar15 = pbVar15 + 1;
        uVar14 = uVar14 >> 8;
        iVar7 = iVar7 + 1;
      } while (iVar7 != 0xb);
      iVar7 = 0xb;
      goto LAB_00108d9a;
    }
    break;
  case ppt_exstop:
    if (pbVar15 != (byte *)0x0) {
      if (pbVar15 + 2 < (encoder->config).begin) {
        return -7;
      }
      if ((encoder->config).end < pbVar15 + 2) {
        return -7;
      }
      bVar6 = 0xe2;
      if (((packet->payload).tnt.bit_size & 1) == 0) {
        bVar6 = 0x62;
      }
      *pbVar15 = 2;
      pbVar15[1] = bVar6;
      goto LAB_00108db1;
    }
    break;
  case ppt_mwait:
    if (pbVar15 != (byte *)0x0) {
      if (pbVar15 + 10 < (encoder->config).begin) {
        return -7;
      }
      if ((encoder->config).end < pbVar15 + 10) {
        return -7;
      }
      pbVar15[0] = 2;
      pbVar15[1] = 0xc2;
      pbVar15 = pbVar15 + 2;
      pVar9 = (packet->payload).pwre;
      iVar7 = 2;
      do {
        *pbVar15 = pVar9.state;
        pbVar15 = pbVar15 + 1;
        pVar9 = (pt_packet_pwre)((uint)pVar9 >> 8);
        iVar7 = iVar7 + 1;
      } while (iVar7 != 6);
      uVar10 = (packet->payload).mwait.ext;
      lVar12 = 0;
      iVar7 = 6;
      do {
        pbVar15[lVar12] = (byte)uVar10;
        uVar10 = uVar10 >> 8;
        lVar12 = lVar12 + 1;
        iVar7 = iVar7 + 1;
      } while ((int)lVar12 != 4);
      pbVar15 = pbVar15 + lVar12;
      goto LAB_00108d9a;
    }
    break;
  case ppt_pwre:
    if (pbVar15 != (byte *)0x0) {
      if (pbVar15 + 4 < (encoder->config).begin) {
        return -7;
      }
      if ((encoder->config).end < pbVar15 + 4) {
        return -7;
      }
      pVar4 = (packet->payload).ip.ipc;
      bVar6 = (packet->payload).pwre.sub_state;
      bVar17 = *(byte *)((long)&packet->payload + 2);
      pbVar15[0] = 2;
      pbVar15[1] = 0x22;
      pbVar15[2] = (bVar17 & 1) << 3;
      pbVar15[3] = bVar6 & 0xf | (byte)((pVar4 << 0xc) >> 8);
      goto LAB_00108ba9;
    }
    break;
  case ppt_pwrx:
    if (pbVar15 != (byte *)0x0) {
      if (pbVar15 + 7 < (encoder->config).begin) {
        return -7;
      }
      if ((encoder->config).end < pbVar15 + 7) {
        return -7;
      }
      bVar6 = *(byte *)((long)&packet->payload + 2);
      uVar10 = (bVar6 & 6) << 9 |
               (bVar6 & 1) << 8 |
               (packet->payload).pwre.sub_state & 0xf | ((packet->payload).ip.ipc & 0xf) << 4;
      pbVar15[0] = 2;
      pbVar15[1] = 0xa2;
      pbVar15 = pbVar15 + 2;
      iVar7 = 2;
      do {
        *pbVar15 = (byte)uVar10;
        pbVar15 = pbVar15 + 1;
        uVar10 = uVar10 >> 8;
        iVar7 = iVar7 + 1;
      } while (iVar7 != 7);
      iVar7 = 7;
      goto LAB_00108d9a;
    }
    break;
  case ppt_ptw:
    bVar6 = (packet->payload).ptw.plc;
    if (bVar6 - 2 < 2) {
      return -5;
    }
    if (bVar6 == 0) {
      lVar12 = 4;
    }
    else {
      if (bVar6 != 1) {
        return -1;
      }
      lVar12 = 8;
    }
    if (pbVar15 != (byte *)0x0) {
      if (pbVar15 + lVar12 + 2 < (encoder->config).begin) {
        return -7;
      }
      if ((encoder->config).end < pbVar15 + lVar12 + 2) {
        return -7;
      }
      bVar17 = 0x92;
      if ((undefined1  [16])((undefined1  [16])packet->payload & (undefined1  [16])0x100) ==
          (undefined1  [16])0x0) {
        bVar17 = 0x12;
      }
      *pbVar15 = 2;
      pbVar15[1] = bVar17 | bVar6 << 5;
      pbVar15 = pbVar15 + 2;
      uVar14 = (packet->payload).pip.cr3;
      iVar8 = 2;
      do {
        *pbVar15 = (byte)uVar14;
        pbVar15 = pbVar15 + 1;
        uVar14 = uVar14 >> 8;
        iVar7 = iVar8 + 1;
        iVar16 = iVar8 - (int)lVar12;
        iVar8 = iVar7;
      } while (iVar16 != 1);
      goto LAB_00108d9a;
    }
    break;
  case ppt_cfe:
    if (pbVar15 != (byte *)0x0) {
      if (pbVar15 + 4 < (encoder->config).begin) {
        return -7;
      }
      if ((encoder->config).end < pbVar15 + 4) {
        return -7;
      }
      pbVar15[0] = 2;
      pbVar15[1] = 0x13;
      pbVar15[2] = *(char *)((long)&packet->payload + 5) << 7 |
                   (packet->payload).tnt.bit_size & 0x1f;
      pbVar15[3] = (packet->payload).cfe.vector;
      goto LAB_00108ba9;
    }
    break;
  case ppt_evd:
    if (pbVar15 != (byte *)0x0) {
      if (pbVar15 + 0xb < (encoder->config).begin) {
        return -7;
      }
      if ((encoder->config).end < pbVar15 + 0xb) {
        return -7;
      }
      pbVar15[0] = 2;
      pbVar15[1] = 0x53;
      pbVar15[2] = (packet->payload).tnt.bit_size & 0x1f;
      pbVar15 = pbVar15 + 3;
      uVar14 = (packet->payload).tnt.payload;
      iVar7 = 3;
      do {
        *pbVar15 = (byte)uVar14;
        pbVar15 = pbVar15 + 1;
        uVar14 = uVar14 >> 8;
        iVar7 = iVar7 + 1;
      } while (iVar7 != 0xb);
      iVar7 = 0xb;
      goto LAB_00108d9a;
    }
  }
  return -1;
}

Assistant:

int pt_enc_next(struct pt_encoder *encoder, const struct pt_packet *packet)
{
	uint8_t *pos, *begin;
	int errcode;

	if (!encoder || !packet)
		return -pte_invalid;

	pos = begin = encoder->pos;
	switch (packet->type) {
	case ppt_pad:
		errcode = pt_reserve(encoder, ptps_pad);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_pad;

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_psb: {
		uint64_t psb;

		errcode = pt_reserve(encoder, ptps_psb);
		if (errcode < 0)
			return errcode;

		psb = ((uint64_t) pt_psb_hilo << 48 |
		       (uint64_t) pt_psb_hilo << 32 |
		       (uint64_t) pt_psb_hilo << 16 |
		       (uint64_t) pt_psb_hilo);

		pos = pt_encode_int(pos, psb, 8);
		pos = pt_encode_int(pos, psb, 8);

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_psbend:
		errcode = pt_reserve(encoder, ptps_psbend);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_psbend;

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_ovf:
		errcode = pt_reserve(encoder, ptps_ovf);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_ovf;

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_fup:
		return pt_encode_ip(encoder, pt_opc_fup, &packet->payload.ip);

	case ppt_tip:
		return pt_encode_ip(encoder, pt_opc_tip, &packet->payload.ip);

	case ppt_tip_pge:
		return pt_encode_ip(encoder, pt_opc_tip_pge,
				    &packet->payload.ip);

	case ppt_tip_pgd:
		return pt_encode_ip(encoder, pt_opc_tip_pgd,
				    &packet->payload.ip);

	case ppt_tnt_8: {
		uint8_t opc, stop;

		if (packet->payload.tnt.bit_size >= 7)
			return -pte_bad_packet;

		errcode = pt_reserve(encoder, ptps_tnt_8);
		if (errcode < 0)
			return errcode;

		stop = packet->payload.tnt.bit_size + pt_opm_tnt_8_shr;
		opc = (uint8_t)
			(packet->payload.tnt.payload << pt_opm_tnt_8_shr);

		*pos++ = (uint8_t) (opc | (1u << stop));

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_tnt_64: {
		uint64_t tnt, stop;

		errcode = pt_reserve(encoder, ptps_tnt_64);
		if (errcode < 0)
			return errcode;

		if (packet->payload.tnt.bit_size >= pt_pl_tnt_64_bits)
			return -pte_invalid;

		stop = 1ull << packet->payload.tnt.bit_size;
		tnt = packet->payload.tnt.payload;

		if (tnt & ~(stop - 1))
			return -pte_invalid;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_tnt_64;
		pos = pt_encode_int(pos, tnt | stop, pt_pl_tnt_64_size);

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_mode: {
		uint8_t mode;

		errcode = pt_reserve(encoder, ptps_mode);
		if (errcode < 0)
			return errcode;

		switch (packet->payload.mode.leaf) {
		default:
			return -pte_bad_packet;

		case pt_mol_exec:
			mode = pt_mol_exec;

			if (packet->payload.mode.bits.exec.csl)
				mode |= pt_mob_exec_csl;

			if (packet->payload.mode.bits.exec.csd)
				mode |= pt_mob_exec_csd;

			if (packet->payload.mode.bits.exec.iflag)
				mode |= pt_mob_exec_iflag;
			break;

		case pt_mol_tsx:
			mode = pt_mol_tsx;

			if (packet->payload.mode.bits.tsx.intx)
				mode |= pt_mob_tsx_intx;

			if (packet->payload.mode.bits.tsx.abrt)
				mode |= pt_mob_tsx_abrt;
			break;
		}

		*pos++ = pt_opc_mode;
		*pos++ = mode;

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_pip: {
		uint64_t cr3;

		errcode = pt_reserve(encoder, ptps_pip);
		if (errcode < 0)
			return errcode;

		cr3 = packet->payload.pip.cr3;
		cr3 >>= pt_pl_pip_shl;
		cr3 <<= pt_pl_pip_shr;

		if (packet->payload.pip.nr)
			cr3 |= (uint64_t) pt_pl_pip_nr;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_pip;
		pos = pt_encode_int(pos, cr3, pt_pl_pip_size);

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_tsc:
		errcode = pt_reserve(encoder, ptps_tsc);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_tsc;
		pos = pt_encode_int(pos, packet->payload.tsc.tsc,
				    pt_pl_tsc_size);

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_cbr:
		errcode = pt_reserve(encoder, ptps_cbr);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_cbr;
		*pos++ = packet->payload.cbr.ratio;
		*pos++ = 0;

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_tma: {
		uint16_t ctc, fc;

		errcode = pt_reserve(encoder, ptps_tma);
		if (errcode < 0)
			return errcode;

		ctc = packet->payload.tma.ctc;
		fc = packet->payload.tma.fc;

		if (fc & ~pt_pl_tma_fc_mask)
			return -pte_bad_packet;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_tma;
		pos = pt_encode_int(pos, ctc, pt_pl_tma_ctc_size);
		*pos++ = 0;
		pos = pt_encode_int(pos, fc, pt_pl_tma_fc_size);

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_mtc:
		errcode = pt_reserve(encoder, ptps_mtc);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_mtc;
		*pos++ = packet->payload.mtc.ctc;

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_cyc: {
		uint8_t byte[pt_pl_cyc_max_size], index, end;
		uint64_t ctc;

		ctc = (uint8_t) packet->payload.cyc.value;
		ctc <<= pt_opm_cyc_shr;

		byte[0] = pt_opc_cyc;
		byte[0] |= (uint8_t) ctc;

		ctc = packet->payload.cyc.value;
		ctc >>= (8 - pt_opm_cyc_shr);
		if (ctc)
			byte[0] |= pt_opm_cyc_ext;

		for (end = 1; ctc; ++end) {
			/* Check if the CYC payload is too big. */
			if (pt_pl_cyc_max_size <= end)
				return -pte_bad_packet;

			ctc <<= pt_opm_cycx_shr;

			byte[end] = (uint8_t) ctc;

			ctc >>= 8;
			if (ctc)
				byte[end] |= pt_opm_cycx_ext;
		}

		errcode = pt_reserve(encoder, end);
		if (errcode < 0)
			return errcode;

		for (index = 0; index < end; ++index)
			*pos++ = byte[index];

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_stop:
		errcode = pt_reserve(encoder, ptps_stop);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_stop;

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_vmcs:
		errcode = pt_reserve(encoder, ptps_vmcs);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_vmcs;
		pos = pt_encode_int(pos,
				    packet->payload.vmcs.base >> pt_pl_vmcs_shl,
				    pt_pl_vmcs_size);

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_mnt:
		errcode = pt_reserve(encoder, ptps_mnt);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_ext2;
		*pos++ = pt_ext2_mnt;
		pos = pt_encode_int(pos, packet->payload.mnt.payload,
				    pt_pl_mnt_size);

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_exstop: {
		uint8_t ext;

		errcode = pt_reserve(encoder, ptps_exstop);
		if (errcode < 0)
			return errcode;

		ext = packet->payload.exstop.ip ?
			pt_ext_exstop_ip : pt_ext_exstop;

		*pos++ = pt_opc_ext;
		*pos++ = ext;

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_mwait:
		errcode = pt_reserve(encoder, ptps_mwait);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_mwait;
		pos = pt_encode_int(pos, packet->payload.mwait.hints,
				    pt_pl_mwait_hints_size);
		pos = pt_encode_int(pos, packet->payload.mwait.ext,
				    pt_pl_mwait_ext_size);

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_pwre: {
		uint64_t payload;

		errcode = pt_reserve(encoder, ptps_pwre);
		if (errcode < 0)
			return errcode;

		payload = 0ull;
		payload |= ((uint64_t) packet->payload.pwre.state <<
			    pt_pl_pwre_state_shr) &
			(uint64_t) pt_pl_pwre_state_mask;
		payload |= ((uint64_t) packet->payload.pwre.sub_state <<
			    pt_pl_pwre_sub_state_shr) &
			(uint64_t) pt_pl_pwre_sub_state_mask;

		if (packet->payload.pwre.hw)
			payload |= (uint64_t) pt_pl_pwre_hw_mask;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_pwre;
		pos = pt_encode_int(pos, payload, pt_pl_pwre_size);

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_pwrx: {
		uint64_t payload;

		errcode = pt_reserve(encoder, ptps_pwrx);
		if (errcode < 0)
			return errcode;

		payload = 0ull;
		payload |= ((uint64_t) packet->payload.pwrx.last <<
			    pt_pl_pwrx_last_shr) &
			(uint64_t) pt_pl_pwrx_last_mask;
		payload |= ((uint64_t) packet->payload.pwrx.deepest <<
			    pt_pl_pwrx_deepest_shr) &
			(uint64_t) pt_pl_pwrx_deepest_mask;

		if (packet->payload.pwrx.interrupt)
			payload |= (uint64_t) pt_pl_pwrx_wr_int;
		if (packet->payload.pwrx.store)
			payload |= (uint64_t) pt_pl_pwrx_wr_store;
		if (packet->payload.pwrx.autonomous)
			payload |= (uint64_t) pt_pl_pwrx_wr_hw;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_pwrx;
		pos = pt_encode_int(pos, payload, pt_pl_pwrx_size);

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_ptw: {
		uint8_t plc, ext;
		int size;

		plc = packet->payload.ptw.plc;

		size = pt_ptw_size(plc);
		if (size < 0)
			return size;

		errcode = pt_reserve(encoder,
				     (unsigned int) (pt_opcs_ptw + size));
		if (errcode < 0)
			return errcode;

		ext = pt_ext_ptw;
		ext |= plc << pt_opm_ptw_pb_shr;

		if (packet->payload.ptw.ip)
			ext |= (uint8_t) pt_opm_ptw_ip;

		*pos++ = pt_opc_ext;
		*pos++ = ext;
		pos = pt_encode_int(pos, packet->payload.ptw.payload, size);

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_cfe: {
		uint8_t type;

		errcode = pt_reserve(encoder, ptps_cfe);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_cfe;

		type = packet->payload.cfe.type & pt_pl_cfe_type;
		if (packet->payload.cfe.ip)
			type |= pt_pl_cfe_ip;

		*pos++ = type;
		*pos++ = packet->payload.cfe.vector;

		encoder->pos = pos;
		return (int) (pos - begin);
	}

	case ppt_evd:
		errcode = pt_reserve(encoder, ptps_evd);
		if (errcode < 0)
			return errcode;

		*pos++ = pt_opc_ext;
		*pos++ = pt_ext_evd;

		*pos++ = packet->payload.evd.type & pt_pl_evd_type;
		pos = pt_encode_int(pos, packet->payload.evd.payload,
				    pt_pl_evd_pl_size);

		encoder->pos = pos;
		return (int) (pos - begin);

	case ppt_unknown:
	case ppt_invalid:
		return -pte_bad_opc;
	}

	return -pte_bad_opc;
}